

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O3

int mbedtls_asn1_write_bool(uchar **p,uchar *start,int boolean)

{
  uchar *puVar1;
  int iVar2;
  
  puVar1 = *p;
  iVar2 = -0x6c;
  if (puVar1 != start && -1 < (long)puVar1 - (long)start) {
    *p = puVar1 + -1;
    puVar1[-1] = boolean != 0;
    puVar1 = *p;
    if (puVar1 != start && -1 < (long)puVar1 - (long)start) {
      *p = puVar1 + -1;
      puVar1[-1] = '\x01';
      puVar1 = *p;
      if (puVar1 != start && -1 < (long)puVar1 - (long)start) {
        *p = puVar1 + -1;
        puVar1[-1] = '\x01';
        iVar2 = 3;
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_asn1_write_bool( unsigned char **p, unsigned char *start, int boolean )
{
    int ret;
    size_t len = 0;

    if( *p - start < 1 )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    *--(*p) = (boolean) ? 1 : 0;
    len++;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_BOOLEAN ) );

    return( (int) len );
}